

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_> __thiscall
Parser::parseFunctionDeclaration(Parser *this)

{
  pointer pcVar1;
  Mark MVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Mark *pMVar4;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar5;
  FunctionDeclarationNode *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Stream *in_RSI;
  unique_ptr<BlockNode,_std::default_delete<BlockNode>_> body;
  TypeName type;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  _Head_base<0UL,_BlockNode_*,_false> local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  byte local_80;
  string local_70;
  string local_50;
  
  pMVar4 = Stream::getMark(in_RSI);
  MVar2 = *pMVar4;
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Expected function declaration!","");
  expectToken((Parser *)in_RSI,KeywordFn,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Expected function name!","");
  getToken((Token *)local_a8,(Parser *)in_RSI,Identifier,&local_70);
  pvVar5 = std::get<0ul,std::__cxx11::string,double>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_a8 + 8));
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pvVar5->_M_dataplus)._M_p;
  paVar6 = &pvVar5->field_2;
  if (paVar3 == paVar6) {
    local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pvVar5->field_2 + 8);
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_50._M_dataplus._M_p = (pointer)paVar3;
  }
  local_50._M_string_length = pvVar5->_M_string_length;
  (pvVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pvVar5->_M_string_length = 0;
  (pvVar5->field_2)._M_local_buf[0] = '\0';
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_80]._M_data)
            ((anon_class_1_0_00000001 *)&local_c0,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)(local_a8 + 8));
  local_80 = 0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  parseArgumentList_abi_cxx11_
            ((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)&local_70,(Parser *)in_RSI);
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Expected colon!","");
  expectToken((Parser *)in_RSI,Colon,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_b8._12_4_ = parseType((Parser *)in_RSI);
  parseBlock((Parser *)local_b8);
  this_00 = (FunctionDeclarationNode *)operator_new(0x60);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          *)local_a8,
         (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          *)&local_70);
  local_c0._M_head_impl = (BlockNode *)local_b8._0_8_;
  local_b8._0_8_ = (istream *)0x0;
  FunctionDeclarationNode::FunctionDeclarationNode
            (this_00,&local_50,(TypeName *)(local_b8 + 0xc),
             (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)local_a8,(unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *)&local_c0);
  (this->tokenizer_).stream_.is_ = (istream *)this_00;
  if (local_c0._M_head_impl != (BlockNode *)0x0) {
    (*((local_c0._M_head_impl)->super_StatementNode).super_Node._vptr_Node[1])();
  }
  local_c0._M_head_impl = (BlockNode *)0x0;
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)local_a8);
  (this_00->super_StatementNode).super_Node.mark_ = MVar2;
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
          )(__uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionDeclarationNode> Parser::parseFunctionDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordFn, "Expected function declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  const auto args = parseArgumentList();

  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();

  auto body = parseBlock();
  auto node = std::make_unique<FunctionDeclarationNode>(name, type, args, std::move(body));
  node->setMark(mark);
  return node;
}